

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
::insert(btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
         *this,const_iterator hint,node_type *node)

{
  bool bVar1;
  slot_type *x;
  int *key;
  iterator iVar2;
  iterator iVar3;
  iterator position;
  slot_type *local_78;
  undefined1 local_70 [12];
  undefined1 local_60 [8];
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
  res;
  node_type *node_local;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  *this_local;
  const_iterator hint_local;
  int local_10;
  
  this_local = (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                *)hint.node;
  hint_local.node._0_4_ = hint.position;
  bVar1 = priv::node_handle_base::operator_cast_to_bool((node_handle_base *)node);
  if (bVar1) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
    ::
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*,_0>
              ((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                *)local_70,
               (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                *)&this_local);
    x = CommonAccess::
        GetSlot<phmap::priv::node_handle<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,std::allocator<int>,void>>
                  (node);
    key = set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>::key(x);
    local_78 = CommonAccess::
               GetSlot<phmap::priv::node_handle<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,std::allocator<int>,void>>
                         (node);
    position._12_4_ = 0;
    position.node =
         (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          *)local_70._0_8_;
    position.position = local_70._8_4_;
    btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
    insert_hint_unique<int*>
              ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
                *)local_60,
               (btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>> *
               )this,position,key,&local_78);
    if (((byte)res.first.position & 1) != 0) {
      CommonAccess::
      Destroy<phmap::priv::node_handle<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,std::allocator<int>,void>>
                (node);
    }
    hint_local._8_8_ = local_60;
    local_10 = (int)res.first.node;
  }
  else {
    iVar2 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
            ::end(&this->
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                 );
    hint_local._8_8_ = iVar2.node;
    local_10 = iVar2.position;
  }
  iVar3.position = local_10;
  iVar3.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                *)hint_local._8_8_;
  iVar3._12_4_ = 0;
  return iVar3;
}

Assistant:

iterator insert(const_iterator hint, node_type &&node) {
            if (!node) return this->end();
            std::pair<iterator, bool> res = this->tree_.insert_hint_unique(
                iterator(hint), params_type::key(CommonAccess::GetSlot(node)),
                CommonAccess::GetSlot(node));
            if (res.second) CommonAccess::Destroy(&node);
            return res.first;
        }